

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O3

void __thiscall TileSwitch::setCharID(TileSwitch *this,char charID)

{
  iterator __position;
  Board *pBVar1;
  iterator iVar2;
  long *plVar3;
  vector<TileSwitch*,std::allocator<TileSwitch*>> *this_00;
  mapped_type *this_01;
  size_t __n;
  long *__dest;
  char local_81;
  locale local_80 [8];
  undefined1 local_78 [32];
  string local_58;
  key_type local_38;
  
  local_81 = charID;
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  iVar2 = std::
          _Hashtable<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(pBVar1->switchKeybinds)._M_h,&(this->super_Tile).field_0x21);
  __dest = *(long **)((long)iVar2.
                            super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                            ._M_cur + 0x10);
  plVar3 = *(long **)((long)iVar2.
                            super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                            ._M_cur + 0x18);
  if (__dest != plVar3) {
    __n = (long)plVar3 - (long)__dest;
    do {
      __n = __n - 8;
      if ((TileSwitch *)*__dest == this) {
        if (__dest + 1 != plVar3) {
          memmove(__dest,__dest + 1,__n);
          plVar3 = *(long **)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                                    ._M_cur + 0x18);
        }
        *(long **)((long)iVar2.
                         super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                         ._M_cur + 0x18) = plVar3 + -1;
        break;
      }
      __dest = __dest + 1;
    } while (__dest != plVar3);
  }
  (this->super_Tile).field_0x21 = charID;
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  this_00 = (vector<TileSwitch*,std::allocator<TileSwitch*>> *)
            std::__detail::
            _Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&pBVar1->switchKeybinds,&local_81);
  __position._M_current = *(TileSwitch ***)(this_00 + 8);
  local_78._0_8_ = this;
  if (__position._M_current == *(TileSwitch ***)(this_00 + 0x10)) {
    std::vector<TileSwitch*,std::allocator<TileSwitch*>>::_M_realloc_insert<TileSwitch*>
              (this_00,__position,(TileSwitch **)local_78);
  }
  else {
    *__position._M_current = this;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  local_38 = &this->super_Tile;
  this_01 = std::__detail::
            _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&pBVar1->tileLabels,&local_38);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
  std::locale::locale(local_80);
  sf::String::String((String *)local_78,&local_58,local_80);
  sf::Text::setString(this_01,(String *)local_78);
  if ((TileSwitch *)local_78._0_8_ != (TileSwitch *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_);
  }
  std::locale::~locale(local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  (*(this->super_Tile)._vptr_Tile[8])(this,1,0);
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  pBVar1->changesMade = true;
  return;
}

Assistant:

void TileSwitch::setCharID(char charID) {
    auto mapIter = getBoardPtr()->switchKeybinds.find(_charID);
    for (auto vectorIter = mapIter->second.begin(); vectorIter != mapIter->second.end(); ++vectorIter) {
        if (*vectorIter == this) {
            mapIter->second.erase(vectorIter);
            break;
        }
    }
    _charID = charID;
    getBoardPtr()->switchKeybinds[charID].push_back(this);
    getBoardPtr()->tileLabels[this].setString(string(1, charID));
    addUpdate(true);
    getBoardPtr()->changesMade = true;
}